

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::CopyADirectory(string *source,string *destination,bool always)

{
  bool bVar1;
  unsigned_long uVar2;
  char *pcVar3;
  ulong dindex;
  Directory dir;
  string fullPath;
  string fullDestPath;
  Directory local_78;
  string local_70;
  string local_50;
  
  Directory::Directory(&local_78);
  bVar1 = Directory::Load(&local_78,source);
  if ((bVar1) && (bVar1 = MakeDirectory(destination,(mode_t *)0x0), bVar1)) {
    for (dindex = 0; uVar2 = Directory::GetNumberOfFiles(&local_78), dindex < uVar2;
        dindex = dindex + 1) {
      pcVar3 = Directory::GetFile(&local_78,dindex);
      if (((*pcVar3 != '.') || (pcVar3[1] != '\0')) &&
         ((pcVar3 = Directory::GetFile(&local_78,dindex), *pcVar3 != '.' ||
          ((pcVar3[1] != '.' || (pcVar3[2] != '\0')))))) {
        std::__cxx11::string::string((string *)&local_70,(string *)source);
        std::__cxx11::string::append((char *)&local_70);
        Directory::GetFile(&local_78,dindex);
        std::__cxx11::string::append((char *)&local_70);
        bVar1 = FileIsDirectory(&local_70);
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_50,(string *)destination);
          std::__cxx11::string::append((char *)&local_50);
          Directory::GetFile(&local_78,dindex);
          std::__cxx11::string::append((char *)&local_50);
          bVar1 = CopyADirectory(&local_70,&local_50,always);
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar1) {
LAB_00107a76:
            std::__cxx11::string::~string((string *)&local_70);
            goto LAB_00107a7e;
          }
        }
        else {
          bVar1 = CopyAFile(&local_70,destination,always);
          if (bVar1) goto LAB_00107a76;
        }
        std::__cxx11::string::~string((string *)&local_70);
        goto LAB_00107a94;
      }
LAB_00107a7e:
    }
    bVar1 = true;
  }
  else {
LAB_00107a94:
    bVar1 = false;
  }
  Directory::~Directory(&local_78);
  return bVar1;
}

Assistant:

bool SystemTools::CopyADirectory(const std::string& source,
                                 const std::string& destination, bool always)
{
  Directory dir;
  if (dir.Load(source) == 0) {
    return false;
  }
  size_t fileNum;
  if (!SystemTools::MakeDirectory(destination)) {
    return false;
  }
  for (fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..")) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath)) {
        std::string fullDestPath = destination;
        fullDestPath += "/";
        fullDestPath += dir.GetFile(static_cast<unsigned long>(fileNum));
        if (!SystemTools::CopyADirectory(fullPath, fullDestPath, always)) {
          return false;
        }
      } else {
        if (!SystemTools::CopyAFile(fullPath, destination, always)) {
          return false;
        }
      }
    }
  }

  return true;
}